

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderIsolines.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShadersIsolines::iterate(TessellationShadersIsolines *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  uint uVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  pointer ppVar7;
  reference p_Var8;
  size_type sVar9;
  reference __dest;
  reference __src;
  mapped_type *this_00;
  undefined1 local_a8 [8];
  _test_result result;
  vector<char,_std::allocator<char>_> rendered_data;
  uint n_rendered_vertices;
  _test_descriptor *test;
  __normal_iterator<glcts::TessellationShadersIsolines::_test_descriptor_*,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>
  local_40;
  __normal_iterator<const_glcts::TessellationShadersIsolines::_test_descriptor_*,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>
  local_38;
  _tests_const_iterator test_iterator;
  _Self local_28;
  _tests_per_vertex_spacing_map_iterator vs_key_iterator;
  GLint gl_max_tess_gen_level_value;
  Functions *gl;
  TessellationShadersIsolines *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  initTest(this);
  (**(code **)(lVar6 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                  ,0x296);
  (**(code **)(lVar6 + 0x5e0))(0x8c89);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glEnable(GL_RASTERIZER_DISCARD) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                  ,0x29a);
  vs_key_iterator._M_node._4_4_ = 0;
  (**(code **)(lVar6 + 0x868))
            ((this->super_TestCaseBase).m_glExtTokens.MAX_TESS_GEN_LEVEL,
             (undefined1 *)((long)&vs_key_iterator._M_node + 4));
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderIsolines.cpp"
                  ,0x2a0);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>,_std::less<glcts::_tessellation_shader_vertex_spacing>,_std::allocator<std::pair<const_glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>_>_>
       ::begin(&this->m_tests);
  while( true ) {
    test_iterator._M_current =
         (_test_descriptor *)
         std::
         map<glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>,_std::less<glcts::_tessellation_shader_vertex_spacing>,_std::allocator<std::pair<const_glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>_>_>
         ::end(&this->m_tests);
    bVar1 = std::operator!=(&local_28,(_Self *)&test_iterator);
    if (!bVar1) break;
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>_>
             ::operator->(&local_28);
    local_40._M_current =
         (_test_descriptor *)
         std::
         vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>
         ::begin(&ppVar7->second);
    __gnu_cxx::
    __normal_iterator<glcts::TessellationShadersIsolines::_test_descriptor_const*,std::vector<glcts::TessellationShadersIsolines::_test_descriptor,std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>>>
    ::__normal_iterator<glcts::TessellationShadersIsolines::_test_descriptor*>
              ((__normal_iterator<glcts::TessellationShadersIsolines::_test_descriptor_const*,std::vector<glcts::TessellationShadersIsolines::_test_descriptor,std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>>>
                *)&local_38,&local_40);
    while( true ) {
      ppVar7 = std::
               _Rb_tree_iterator<std::pair<const_glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>_>
               ::operator->(&local_28);
      test = (_test_descriptor *)
             std::
             vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>
             ::end(&ppVar7->second);
      bVar1 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<glcts::TessellationShadersIsolines::_test_descriptor_*,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>
                          *)&test);
      if (!bVar1) break;
      p_Var8 = __gnu_cxx::
               __normal_iterator<const_glcts::TessellationShadersIsolines::_test_descriptor_*,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>
               ::operator*(&local_38);
      uVar4 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                        (this->m_utils_ptr,TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST,
                         p_Var8->inner_tess_levels,p_Var8->outer_tess_levels,
                         p_Var8->vertex_spacing_mode,false);
      TessellationShaderUtils::getDataGeneratedByTessellator
                ((vector<char,_std::allocator<char>_> *)&result.outer2_tess_level,this->m_utils_ptr,
                 p_Var8->inner_tess_levels,false,TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST,
                 TESSELLATION_SHADER_VERTEX_ORDERING_CCW,p_Var8->vertex_spacing_mode,
                 p_Var8->outer_tess_levels);
      _test_result::_test_result((_test_result *)local_a8);
      result.rendered_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = (int)p_Var8->irrelevant_tess_level;
      result.rendered_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (int)p_Var8->outer_tess_levels[0];
      result.irrelevant_tess_level = (int)p_Var8->outer_tess_levels[1];
      local_a8._4_4_ = uVar4;
      result._0_8_ = p_Var8;
      sVar9 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)&result.outer2_tess_level);
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)&result.parent,sVar9 >> 2);
      sVar9 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)&result.outer2_tess_level);
      if (sVar9 != 0) {
        __dest = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)&result.parent,0);
        __src = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)&result.outer2_tess_level,0);
        sVar9 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)&result.outer2_tess_level);
        memcpy(__dest,__src,sVar9);
      }
      countIsolines(this,(_test_result *)local_a8);
      this_00 = std::
                map<glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_result,_std::allocator<glcts::TessellationShadersIsolines::_test_result>_>,_std::less<glcts::_tessellation_shader_vertex_spacing>,_std::allocator<std::pair<const_glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_result,_std::allocator<glcts::TessellationShadersIsolines::_test_result>_>_>_>_>
                ::operator[](&this->m_test_results,&p_Var8->vertex_spacing_mode);
      std::
      vector<glcts::TessellationShadersIsolines::_test_result,_std::allocator<glcts::TessellationShadersIsolines::_test_result>_>
      ::push_back(this_00,(value_type *)local_a8);
      _test_result::~_test_result((_test_result *)local_a8);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)&result.outer2_tess_level);
      __gnu_cxx::
      __normal_iterator<const_glcts::TessellationShadersIsolines::_test_descriptor_*,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>
      ::operator++(&local_38,0);
    }
    std::
    _Rb_tree_iterator<std::pair<const_glcts::_tessellation_shader_vertex_spacing,_std::vector<glcts::TessellationShadersIsolines::_test_descriptor,_std::allocator<glcts::TessellationShadersIsolines::_test_descriptor>_>_>_>
    ::operator++(&local_28,0);
  }
  runForAllTestResults(this,checkFirstOuterTessellationLevelEffect);
  runForAllTestResults(this,checkSecondOuterTessellationLevelEffect);
  checkIrrelevantTessellationLevelsHaveNoEffect(this);
  checkVertexSpacingDoesNotAffectAmountOfGeneratedIsolines(this);
  runForAllTestResults(this,checkNoLineSegmentIsDefinedAtHeightOne);
  tcu::TestContext::setTestResult
            ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult TessellationShadersIsolines::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initTest();

	/* We only need to use one vertex per so go for it */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname");

	/* We don't need to rasterize anything in this test */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed");

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value before we continue */
	glw::GLint gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname.");

	/* To perform actual tests, we need to first retrieve the tessellated coordinates data.
	 * Run all tests configured and fill per-test buffer with the information.
	 **/
	for (_tests_per_vertex_spacing_map_iterator vs_key_iterator = m_tests.begin(); vs_key_iterator != m_tests.end();
		 vs_key_iterator++)
	{
		for (_tests_const_iterator test_iterator = vs_key_iterator->second.begin();
			 test_iterator != vs_key_iterator->second.end(); test_iterator++)
		{
			const _test_descriptor& test = *test_iterator;

			/* Capture tessellation data for considered configuration */
			unsigned int n_rendered_vertices = m_utils_ptr->getAmountOfVerticesGeneratedByTessellator(
				TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES, test.inner_tess_levels, test.outer_tess_levels,
				test.vertex_spacing_mode, false); /* is_point_mode_enabled */
			std::vector<char> rendered_data = m_utils_ptr->getDataGeneratedByTessellator(
				test.inner_tess_levels, false, /* point mode */
				TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES, TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
				test.vertex_spacing_mode, test.outer_tess_levels);

			/* Store the data in a test result descriptor */
			_test_result result;

			result.n_vertices			 = n_rendered_vertices;
			result.parent				 = &test;
			result.irrelevant_tess_level = (int)test.irrelevant_tess_level;
			result.outer1_tess_level	 = (int)test.outer_tess_levels[0];
			result.outer2_tess_level	 = (int)test.outer_tess_levels[1];
			result.rendered_data.resize(rendered_data.size() / sizeof(float));
			if (0 != rendered_data.size())
			{
				memcpy(&result.rendered_data[0], &rendered_data[0], rendered_data.size());
			}
			countIsolines(result);

			/* Store the test run descriptor. */
			m_test_results[test.vertex_spacing_mode].push_back(result);
		}
	}

	/* Now we can proceed with actual tests */
	/* (test 1): Make sure amount of isolines is determined by first outer tessellation level */
	runForAllTestResults(checkFirstOuterTessellationLevelEffect);

	/* (test 2): Make sure amount of line segments per height is determined by second outer
	 *           tessellation level.
	 */
	runForAllTestResults(checkSecondOuterTessellationLevelEffect);

	/* (test 3): Make sure 3rd, 4th outer tessellation levels, as well as all inner tessellation
	 *           levels have no impact on the tessellated coordinates */
	checkIrrelevantTessellationLevelsHaveNoEffect();

	/* (test 4): Make sure no matter what vertex spacing is requested in TC stage, it is always
	 *           equal_spacing that is applied.
	 */
	checkVertexSpacingDoesNotAffectAmountOfGeneratedIsolines();

	/* (test 5): Make sure that no data set features a line segment at height of 1. */
	runForAllTestResults(checkNoLineSegmentIsDefinedAtHeightOne);

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}